

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O3

void __thiscall dlib::drawable::enable(drawable *this)

{
  auto_mutex M;
  auto_mutex local_20;
  
  local_20.r = this->m;
  local_20.m = (mutex *)0x0;
  local_20.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_20.r,1);
  this->enabled = true;
  base_window::invalidate_rectangle(&this->parent->super_base_window,&this->rect);
  auto_mutex::unlock(&local_20);
  return;
}

Assistant:

virtual void enable (
        ) 
        {
            auto_mutex M(m);
            enabled = true;
            parent.invalidate_rectangle(rect);
        }